

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

SPIRVariable * __thiscall
spirv_cross::Compiler::maybe_get_backing_variable(Compiler *this,uint32_t chain)

{
  uint32_t uVar1;
  SPIRExpression *pSVar2;
  SPIRAccessChain *pSVar3;
  SPIRAccessChain *access_chain;
  SPIRExpression *cexpr;
  SPIRVariable *var;
  uint32_t chain_local;
  Compiler *this_local;
  
  cexpr = (SPIRExpression *)maybe_get<spirv_cross::SPIRVariable>(this,chain);
  if (cexpr == (SPIRExpression *)0x0) {
    pSVar2 = maybe_get<spirv_cross::SPIRExpression>(this,chain);
    if (pSVar2 != (SPIRExpression *)0x0) {
      uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSVar2->loaded_from);
      cexpr = (SPIRExpression *)maybe_get<spirv_cross::SPIRVariable>(this,uVar1);
    }
    pSVar3 = maybe_get<spirv_cross::SPIRAccessChain>(this,chain);
    if (pSVar3 != (SPIRAccessChain *)0x0) {
      uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSVar3->loaded_from);
      cexpr = (SPIRExpression *)maybe_get<spirv_cross::SPIRVariable>(this,uVar1);
    }
  }
  return (SPIRVariable *)cexpr;
}

Assistant:

SPIRVariable *Compiler::maybe_get_backing_variable(uint32_t chain)
{
	auto *var = maybe_get<SPIRVariable>(chain);
	if (!var)
	{
		auto *cexpr = maybe_get<SPIRExpression>(chain);
		if (cexpr)
			var = maybe_get<SPIRVariable>(cexpr->loaded_from);

		auto *access_chain = maybe_get<SPIRAccessChain>(chain);
		if (access_chain)
			var = maybe_get<SPIRVariable>(access_chain->loaded_from);
	}

	return var;
}